

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[6],unsigned_int,char_const(&)[3],unsigned_int,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [6],uint *params_1,
          char (*params_2) [3],uint *params_3,char (*params_4) [2])

{
  char (*value) [6];
  uint *puVar1;
  char (*value_00) [3];
  char (*value_01) [2];
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_98;
  CappedArray<char,_14UL> local_88;
  ArrayPtr<const_char> local_70;
  CappedArray<char,_14UL> local_60;
  ArrayPtr<const_char> local_48;
  char (*local_38) [2];
  char (*params_local_4) [2];
  uint *params_local_3;
  char (*params_local_2) [3];
  uint *params_local_1;
  char (*params_local) [6];
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = (char (*) [2])params_3;
  params_local_4 = (char (*) [2])params_2;
  params_local_3 = params_1;
  params_local_2 = (char (*) [3])params;
  params_local_1 = (uint *)this;
  params_local = (char (*) [6])__return_storage_ptr__;
  value = ::const((char (*) [6])this);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[6]>(value);
  puVar1 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_local_2);
  _::toStringTreeOrCharSequence<unsigned_int>(&local_60,puVar1);
  value_00 = ::const((char (*) [3])params_local_3);
  local_70 = _::toStringTreeOrCharSequence<char_const(&)[3]>(value_00);
  puVar1 = fwd<unsigned_int>((NoInfer<unsigned_int> *)params_local_4);
  _::toStringTreeOrCharSequence<unsigned_int>(&local_88,puVar1);
  value_01 = ::const(local_38);
  local_98 = _::toStringTreeOrCharSequence<char_const(&)[2]>(value_01);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,(StringTree *)&local_48,(ArrayPtr<const_char> *)&local_60,
             (CappedArray<char,_14UL> *)&local_70,(ArrayPtr<const_char> *)&local_88,
             (CappedArray<char,_14UL> *)&local_98,(ArrayPtr<const_char> *)__return_storage_ptr___00)
  ;
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}